

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
ft::
map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::erase(map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,iterator *position)

{
  bool bVar1;
  treeIterator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_30;
  iterator *local_18;
  iterator *position_local;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  local_18 = position;
  position_local = (iterator *)this;
  treeIterator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::treeIterator(&local_30,position);
  treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::BSTerase((treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this,&local_30);
  treeIterator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~treeIterator(&local_30);
  (this->
  super_mapBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).
  super_treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .m_size = (this->
            super_mapBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ).
            super_treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .m_size - 1;
  bVar1 = treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this);
  if (bVar1) {
    treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::treeInit((treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this);
  }
  return;
}

Assistant:

void	erase(iterator position)
	{
		this->BSTerase(position);

		--this->m_size;
		if (this->empty()) {
			this->treeInit();
		}
	}